

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_setglobals_unittest.cc
# Opt level: O0

void Test_SetGlobalValue_TemplateDictionary::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  char *__s1;
  TemplateString local_110;
  TemplateDictionaryPeer local_e0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_b8 [8];
  TemplateDictionary tpl;
  TemplateString local_48;
  TemplateString local_28;
  
  ctemplate::TemplateString::TemplateString(&local_28,"TEST_GLOBAL_VAR");
  ctemplate::TemplateString::TemplateString(&local_48,"test_value");
  TVar1.length_ = local_28.length_;
  TVar1.ptr_ = local_28.ptr_;
  TVar1.is_immutable_ = local_28.is_immutable_;
  TVar1._17_7_ = local_28._17_7_;
  TVar1.id_ = local_28.id_;
  TVar2.length_ = local_48.length_;
  TVar2.ptr_ = local_48.ptr_;
  TVar2.is_immutable_ = local_48.is_immutable_;
  TVar2._17_7_ = local_48._17_7_;
  TVar2.id_ = local_48.id_;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar1,TVar2);
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"empty");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_b8,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_e0,local_b8);
  ctemplate::TemplateString::TemplateString(&local_110,"TEST_GLOBAL_VAR");
  __s1 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_e0,&local_110);
  iVar3 = strcmp(__s1,"test_value");
  if (iVar3 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(local_b8);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"TEST_GLOBAL_VAR\"), \"test_value\") == 0");
  exit(1);
}

Assistant:

TEST(SetGlobalValue, TemplateDictionary) {
  // Test to see that the global dictionary object gets created when you
  // first call the static function TemplateDictionary::SetGlobalValue().
  TemplateDictionary::SetGlobalValue("TEST_GLOBAL_VAR", "test_value");
  TemplateDictionary tpl("empty");
  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&tpl);
  EXPECT_STREQ(peer.GetSectionValue("TEST_GLOBAL_VAR"),
               "test_value");

}